

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

Vec_Wec_t * Vec_WecStart(int nSize)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  
  pVVar2 = (Vec_Wec_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = (Vec_Int_t *)calloc((long)iVar1,0x10);
  }
  pVVar2->pArray = pVVar3;
  pVVar2->nSize = nSize;
  return pVVar2;
}

Assistant:

static inline Vec_Wec_t * Vec_WecStart( int nSize )
{
    Vec_Wec_t * p;
    p = Vec_WecAlloc( nSize );
    p->nSize = nSize;
    return p;
}